

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

DesugaredObject * jsonnet::internal::makeStdlibAST(Allocator *alloc,string *filename)

{
  DesugaredObject *pDVar1;
  Desugarer desugarer;
  string local_40;
  Desugarer local_20;
  
  local_20.isStdlib = true;
  local_20.alloc = alloc;
  std::__cxx11::string::string((string *)&local_40,(string *)filename);
  pDVar1 = Desugarer::stdlibAST(&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return pDVar1;
}

Assistant:

DesugaredObject *makeStdlibAST(Allocator *alloc, std::string filename) {
    Desugarer desugarer(alloc, true);
    return desugarer.stdlibAST(filename);
}